

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkmap.c
# Opt level: O3

void remove_rooms(level *lev,int lx,int ly,int hx,int hy)

{
  char cVar1;
  char cVar2;
  uint uVar3;
  bool bVar4;
  int iVar5;
  long lVar6;
  undefined1 *puVar7;
  xchar xVar8;
  long lVar9;
  uint *puVar10;
  mkroom *croom;
  coord *__dest;
  ulong uVar11;
  
  uVar11 = (ulong)lev->nroom;
  if (0 < (long)uVar11) {
    do {
      iVar5 = (int)lev->doors[uVar11 * 0x6c + 0xc].y;
      if (lx <= iVar5) {
        __dest = lev->doors + uVar11 * 0x6c + 0xc;
        if (((__dest->x < hx) && (ly <= __dest[1].y)) && (__dest[1].x < hy)) {
          if (((__dest[1].y < hy) && (iVar5 < hx)) && ((lx <= __dest->x && (ly <= __dest[1].x)))) {
            uVar3 = lev->nroom;
            lev->nroom = uVar3 - 1;
            if (uVar11 != uVar3) {
              memcpy(__dest,lev->doors + (long)(int)uVar3 * 0x6c + 0xc,0xd8);
              cVar1 = __dest->x;
              cVar2 = __dest->y;
              if (cVar1 <= cVar2) {
                iVar5 = lev->nroom;
                xVar8 = __dest[1].y;
                puVar7 = &lev->locations[cVar1][0].field_0x6;
                lVar6 = (long)cVar1;
                do {
                  cVar1 = __dest[1].x;
                  if (cVar1 <= xVar8) {
                    lVar9 = (long)cVar1 + -1;
                    puVar10 = (uint *)(puVar7 + (long)cVar1 * 0xc);
                    do {
                      if ((*puVar10 >> 0x10 & 0x3f) == iVar5 + 3U) {
                        *puVar10 = *puVar10 & 0xffc0ffff |
                                   (int)(uVar11 - 1) * 0x10000 + 0x30000U & 0x3f0000;
                        xVar8 = __dest[1].y;
                      }
                      lVar9 = lVar9 + 1;
                      puVar10 = puVar10 + 3;
                    } while (lVar9 < xVar8);
                  }
                  puVar7 = puVar7 + 0xfc;
                  bVar4 = lVar6 < cVar2;
                  lVar6 = lVar6 + 1;
                } while (bVar4);
              }
            }
            lev->doors[(long)(int)uVar3 * 0x6c + 0xc].y = -1;
          }
          else if (__dest[5].x == '\0') {
            impossible("regular room in joined map");
          }
        }
      }
      bVar4 = 1 < (long)uVar11;
      uVar11 = uVar11 - 1;
    } while (bVar4);
  }
  return;
}

Assistant:

void remove_rooms(struct level *lev, int lx, int ly, int hx, int hy)
{
    int i;
    struct mkroom *croom;

    for (i = lev->nroom - 1; i >= 0; --i) {
	croom = &lev->rooms[i];
	if (croom->hx < lx || croom->lx >= hx ||
	    croom->hy < ly || croom->ly >= hy) continue; /* no overlap */

	if (croom->lx < lx || croom->hx >= hx ||
	    croom->ly < ly || croom->hy >= hy) { /* partial overlap */
	    /* TODO: ensure remaining parts of room are still joined */

	    if (!croom->irregular) impossible("regular room in joined map");
	} else {
	    /* total overlap, remove the room */
	    remove_room(lev, (unsigned)i);
	}
    }
}